

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,AssignmentNode *node)

{
  ostream *poVar1;
  string *psVar2;
  PrintVisitor *this_00;
  mapped_type *pmVar3;
  PrintVisitor *this_01;
  element_type *peVar4;
  AssignmentNode *in_RSI;
  long in_RDI;
  PrintVisitor visitor;
  key_type *in_stack_fffffffffffffea8;
  unordered_map<AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<AssignmentOperator>,_std::equal_to<AssignmentOperator>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffeb0;
  uint indentation;
  ostream *in_stack_fffffffffffffeb8;
  PrintVisitor *in_stack_fffffffffffffed8;
  string local_b8 [32];
  undefined1 local_98 [24];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  AssignmentNode *local_10;
  
  poVar1 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_fffffffffffffed8);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"AssignmentNode:\n");
  std::__cxx11::string::~string(local_30);
  poVar1 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_fffffffffffffed8);
  poVar1 = std::operator<<(poVar1,local_60);
  poVar1 = std::operator<<(poVar1,"Name: ");
  psVar2 = AssignmentNode::getName_abi_cxx11_(local_10);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_60);
  poVar1 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_fffffffffffffed8);
  poVar1 = std::operator<<(poVar1,local_80);
  this_00 = (PrintVisitor *)std::operator<<(poVar1,"Operator: ");
  AssignmentNode::getOperation(local_10);
  pmVar3 = std::
           unordered_map<AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<AssignmentOperator>,_std::equal_to<AssignmentOperator>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  indentation = (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  this_01 = (PrintVisitor *)std::operator<<((ostream *)this_00,(string *)pmVar3);
  std::operator<<((ostream *)this_01,"\n");
  std::__cxx11::string::~string(local_80);
  PrintVisitor(this_01,in_stack_fffffffffffffeb8,indentation);
  poVar1 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(this_00);
  poVar1 = std::operator<<(poVar1,local_b8);
  std::operator<<(poVar1,"Value:\n");
  std::__cxx11::string::~string(local_b8);
  AssignmentNode::getValue(local_10);
  peVar4 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1676cb);
  (*(peVar4->super_Node)._vptr_Node[2])(peVar4,local_98);
  ~PrintVisitor((PrintVisitor *)0x1676ee);
  return;
}

Assistant:

void PrintVisitor::visit(const AssignmentNode& node)
{
  stream_ << indent() << "AssignmentNode:\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Operator: " << 
    AssignmentOperationNames.at(node.getOperation()) << "\n";

  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Value:\n";
  node.getValue()->accept(visitor);
}